

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brandes.cpp
# Opt level: O2

void write_results(string *file_name)

{
  double dVar1;
  pointer ppVar2;
  _Base_ptr p_Var3;
  ostream *poVar4;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *__range1;
  pointer ppVar5;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> result_vertices;
  pair<int,_double> local_230;
  ofstream output_file;
  
  std::ofstream::ofstream((string *)&output_file);
  std::ofstream::open((string *)&output_file,(_Ios_Openmode)file_name);
  result_vertices.
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result_vertices.
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result_vertices.
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var3 = non_dead_end_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &non_dead_end_vertices._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    local_230.first =
         read_remapped.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_start[(int)p_Var3[1]._M_color];
    local_230.second =
         betweenness_centrality.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[(int)p_Var3[1]._M_color];
    std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
    emplace_back<std::pair<int,double>>
              ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
               &result_vertices,&local_230);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (result_vertices.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             result_vertices.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  ppVar2 = result_vertices.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (ppVar5 = result_vertices.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar2; ppVar5 = ppVar5 + 1) {
    dVar1 = ppVar5->second;
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&output_file,ppVar5->first);
    std::operator<<(poVar4," ");
    poVar4 = std::ostream::_M_insert<double>(dVar1);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::ofstream::close();
  std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~_Vector_base
            (&result_vertices.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>);
  std::ofstream::~ofstream(&output_file);
  return;
}

Assistant:

void write_results(std::string file_name) {
    std::ofstream output_file;
    output_file.open(file_name);

    std::vector<std::pair<int, double>> result_vertices;

    for (auto v : non_dead_end_vertices) {
        result_vertices.push_back(std::pair<int, double>(read_remapped[v], betweenness_centrality[v]));
    }

    sort(result_vertices.begin(), result_vertices.end());

    for (auto v : result_vertices) {
        output_file << v.first << " " << v.second << std::endl;
    }

    output_file.close();
}